

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O1

void __thiscall diffusion::Tokenizer::push(Tokenizer *this,string *raw_data)

{
  mutex *__mutex;
  int iVar1;
  pointer __src;
  int iVar2;
  ErrorDataCorruption *this_00;
  undefined8 uVar3;
  ulong __n;
  vector<char,_std::allocator<char>_> result;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::_M_append((char *)this,(ulong)(raw_data->_M_dataplus)._M_p);
  iVar1 = *(int *)(this->unprocessed_data_)._M_dataplus._M_p;
  __n = (ulong)iVar1;
  std::__cxx11::string::erase((ulong)this,0);
  if ((long)__n < 0) {
    this_00 = (ErrorDataCorruption *)__cxa_allocate_exception(0x10);
    ErrorDataCorruption::ErrorDataCorruption(this_00);
    __cxa_throw(this_00,&ErrorDataCorruption::typeinfo,std::runtime_error::~runtime_error);
  }
  if (__n <= (this->unprocessed_data_)._M_string_length) {
    __mutex = &this->queue_mutex_;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar3 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar3);
    }
    __src = (this->unprocessed_data_)._M_dataplus._M_p;
    std::vector<char,_std::allocator<char>_>::vector(&local_38,__n,&local_39);
    if (iVar1 != 0) {
      memmove(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,__src,__n);
    }
    std::
    deque<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
    ::emplace_back<std::vector<char,std::allocator<char>>>
              ((deque<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                *)&this->processed_data_queue_,&local_38);
    if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::erase((ulong)this,0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void push(std::string const & raw_data) {
        unprocessed_data_ += raw_data;
        auto message_length = *reinterpret_cast<Size *>(&unprocessed_data_[0]);
        unprocessed_data_.erase(0, sizeof(Size));
        if (message_length < 0)
            throw ErrorDataCorruption();
        if (static_cast<std::size_t>(message_length) > unprocessed_data_.size()) {
        } else {
            std::lock_guard<std::mutex> lock(queue_mutex_);
            processed_data_queue_.push_back(to_vector_char(&unprocessed_data_[0], message_length));
            unprocessed_data_.erase(0, message_length);
        }
    }